

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O3

int Sim_NtkSimTwoPats_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  uint uVar6;
  int in_EDX;
  int Fill;
  
  pAVar3 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNode->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] == iVar2) {
    uVar5 = (pNode->field_6).iTemp;
  }
  else {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    uVar5 = Sim_NtkSimTwoPats_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray])
    ;
    uVar6 = Sim_NtkSimTwoPats_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
    uVar5 = ((*(int *)&pNode->field_0x14 << 0x14) >> 0x1f ^ uVar6) &
            ((*(int *)&pNode->field_0x14 << 0x15) >> 0x1f ^ uVar5);
    pNode->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)(int)uVar5;
  }
  return uVar5;
}

Assistant:

int Sim_NtkSimTwoPats_rec( Abc_Obj_t * pNode )
{
    int Value0, Value1;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return (int)(ABC_PTRUINT_T)pNode->pCopy;
    Abc_NodeSetTravIdCurrent( pNode );
    Value0 = Sim_NtkSimTwoPats_rec( Abc_ObjFanin0(pNode) );
    Value1 = Sim_NtkSimTwoPats_rec( Abc_ObjFanin1(pNode) );
    if ( Abc_ObjFaninC0(pNode) )
        Value0 = ~Value0;
    if ( Abc_ObjFaninC1(pNode) )
        Value1 = ~Value1;
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(Value0 & Value1);
    return Value0 & Value1;
}